

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateReset2(z_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  int iVar2;
  inflate_state *state;
  int wrap;
  int32_t windowBits_local;
  z_stream *strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (windowBits < 0) {
      state._0_4_ = 0;
      if (windowBits < -0xf) {
        return -2;
      }
      state._4_4_ = -windowBits;
    }
    else {
      state._0_4_ = (windowBits >> 4) + 5;
      state._4_4_ = windowBits;
      if (windowBits < 0x30) {
        state._4_4_ = windowBits & 0xf;
      }
    }
    if ((state._4_4_ == 0) || ((7 < (int)state._4_4_ && ((int)state._4_4_ < 0x10)))) {
      *(int *)&piVar1->pending_out = (int)state;
      piVar1->reproducible = state._4_4_;
      strm_local._4_4_ = inflateReset(strm);
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset2)(PREFIX3(stream) *strm, int32_t windowBits) {
    int wrap;
    struct inflate_state *state;

    /* get the state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
    } else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= MAX_WBITS;
#endif
    }

    /* set number of window bits */
    if (windowBits && (windowBits < MIN_WBITS || windowBits > MAX_WBITS))
        return Z_STREAM_ERROR;

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return PREFIX(inflateReset)(strm);
}